

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAuxSourceDirectoryCommand.cxx
# Opt level: O2

bool __thiscall
cmAuxSourceDirectoryCommand::InitialPass
          (cmAuxSourceDirectoryCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  string *in_name;
  bool bVar1;
  long lVar2;
  char *pcVar3;
  unsigned_long uVar4;
  long lVar5;
  cmake *this_00;
  cmSourceFile *this_01;
  unsigned_long dindex;
  allocator<char> local_159;
  cmCommand *local_158;
  Directory dir;
  string sourceListValue;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string tdir;
  string file;
  string base;
  string fullname;
  string local_70;
  string ext;
  
  in_name = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  lVar2 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)in_name;
  local_158 = &this->super_cmCommand;
  if (lVar2 == 0x40) {
    sourceListValue._M_dataplus._M_p = (pointer)&sourceListValue.field_2;
    sourceListValue._M_string_length = 0;
    sourceListValue.field_2._M_local_buf[0] = '\0';
    tdir._M_dataplus._M_p = (pointer)&tdir.field_2;
    tdir._M_string_length = 0;
    tdir.field_2._M_local_buf[0] = '\0';
    bVar1 = cmsys::SystemTools::FileIsFullPath(in_name);
    if (bVar1) {
      std::__cxx11::string::_M_assign((string *)&tdir);
    }
    else {
      cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(local_158->Makefile);
      std::__cxx11::string::_M_assign((string *)&tdir);
      std::__cxx11::string::append((char *)&tdir);
      std::__cxx11::string::append((string *)&tdir);
    }
    pcVar3 = cmMakefile::GetDefinition
                       (local_158->Makefile,
                        (args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + 1);
    if (pcVar3 != (char *)0x0) {
      std::__cxx11::string::assign((char *)&sourceListValue);
    }
    files.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    files.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    files.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cmsys::Directory::Directory(&dir);
    bVar1 = cmsys::Directory::Load(&dir,&tdir);
    if (bVar1) {
      uVar4 = cmsys::Directory::GetNumberOfFiles(&dir);
      for (dindex = 0; uVar4 != dindex; dindex = dindex + 1) {
        pcVar3 = cmsys::Directory::GetFile(&dir,dindex);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&file,pcVar3,(allocator<char> *)&ext);
        lVar5 = std::__cxx11::string::rfind((char)&file,0x2e);
        if (lVar5 != -1) {
          std::__cxx11::string::substr((ulong)&ext,(ulong)&file);
          std::__cxx11::string::substr((ulong)&base,(ulong)&file);
          this_00 = cmMakefile::GetCMakeInstance(local_158->Makefile);
          if (base._M_string_length != 0) {
            bVar1 = cmake::IsSourceExtension(this_00,&ext);
            if (bVar1) {
              std::__cxx11::string::string((string *)&fullname,(string *)in_name);
              std::__cxx11::string::append((char *)&fullname);
              std::__cxx11::string::append((string *)&fullname);
              this_01 = cmMakefile::GetOrCreateSource(local_158->Makefile,&fullname,false,Ambiguous)
              ;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_70,"ABSTRACT",&local_159);
              cmSourceFile::SetProperty(this_01,&local_70,"0");
              std::__cxx11::string::~string((string *)&local_70);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&files
                         ,&fullname);
              std::__cxx11::string::~string((string *)&fullname);
            }
          }
          std::__cxx11::string::~string((string *)&base);
          std::__cxx11::string::~string((string *)&ext);
        }
        std::__cxx11::string::~string((string *)&file);
      }
    }
    std::
    __sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (files.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               files.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    if (sourceListValue._M_string_length != 0) {
      std::__cxx11::string::append((char *)&sourceListValue);
    }
    cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>(&file,&files,";")
    ;
    std::__cxx11::string::append((string *)&sourceListValue);
    std::__cxx11::string::~string((string *)&file);
    cmMakefile::AddDefinition
              (local_158->Makefile,
               (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + 1,sourceListValue._M_dataplus._M_p);
    cmsys::Directory::~Directory(&dir);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&files);
    std::__cxx11::string::~string((string *)&tdir);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sourceListValue,"called with incorrect number of arguments",
               (allocator<char> *)&tdir);
    cmCommand::SetError(local_158,&sourceListValue);
  }
  std::__cxx11::string::~string((string *)&sourceListValue);
  return lVar2 == 0x40;
}

Assistant:

bool cmAuxSourceDirectoryCommand::InitialPass(
  std::vector<std::string> const& args, cmExecutionStatus&)
{
  if (args.size() != 2) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }

  std::string sourceListValue;
  std::string const& templateDirectory = args[0];
  std::string tdir;
  if (!cmSystemTools::FileIsFullPath(templateDirectory)) {
    tdir = this->Makefile->GetCurrentSourceDirectory();
    tdir += "/";
    tdir += templateDirectory;
  } else {
    tdir = templateDirectory;
  }

  // was the list already populated
  const char* def = this->Makefile->GetDefinition(args[1]);
  if (def) {
    sourceListValue = def;
  }

  std::vector<std::string> files;

  // Load all the files in the directory
  cmsys::Directory dir;
  if (dir.Load(tdir)) {
    size_t numfiles = dir.GetNumberOfFiles();
    for (size_t i = 0; i < numfiles; ++i) {
      std::string file = dir.GetFile(static_cast<unsigned long>(i));
      // Split the filename into base and extension
      std::string::size_type dotpos = file.rfind('.');
      if (dotpos != std::string::npos) {
        std::string ext = file.substr(dotpos + 1);
        std::string base = file.substr(0, dotpos);
        // Process only source files
        auto cm = this->Makefile->GetCMakeInstance();
        if (!base.empty() && cm->IsSourceExtension(ext)) {
          std::string fullname = templateDirectory;
          fullname += "/";
          fullname += file;
          // add the file as a class file so
          // depends can be done
          cmSourceFile* sf = this->Makefile->GetOrCreateSource(fullname);
          sf->SetProperty("ABSTRACT", "0");
          files.push_back(std::move(fullname));
        }
      }
    }
  }
  std::sort(files.begin(), files.end());
  if (!sourceListValue.empty()) {
    sourceListValue += ";";
  }
  sourceListValue += cmJoin(files, ";");
  this->Makefile->AddDefinition(args[1], sourceListValue.c_str());
  return true;
}